

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
AlchoholicCustomer::order
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AlchoholicCustomer *this,
          vector<Dish,_std::allocator<Dish>_> *menu)

{
  DishType DVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  int local_48;
  int i_1;
  int local_38;
  int i;
  int size;
  int local_24;
  int lastCheckedIndex;
  int lastChecked;
  vector<Dish,_std::allocator<Dish>_> *menu_local;
  AlchoholicCustomer *this_local;
  vector<int,_std::allocator<int>_> *newOrder;
  
  local_24 = 0x7f;
  size = 0x7f;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  sVar3 = std::vector<Dish,_std::allocator<Dish>_>::size(menu);
  if (this->minInx != this->maxInx) {
    if ((this->ordered & 1U) == 0) {
      for (local_38 = 0; local_38 < (int)sVar3; local_38 = local_38 + 1) {
        pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_38);
        DVar1 = Dish::getType(pvVar4);
        if (DVar1 == ALC) {
          pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_38);
          iVar2 = Dish::getPrice(pvVar4);
          if (iVar2 < this->minAlc) {
            pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_38);
            iVar2 = Dish::getPrice(pvVar4);
            this->minAlc = iVar2;
            this->minInx = local_38;
          }
        }
        pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_38);
        DVar1 = Dish::getType(pvVar4);
        if (DVar1 == ALC) {
          pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_38);
          iVar2 = Dish::getPrice(pvVar4);
          if (*(int *)&(this->super_Customer).field_0x2c <= iVar2) {
            pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_38);
            iVar2 = Dish::getPrice(pvVar4);
            *(int *)&(this->super_Customer).field_0x2c = iVar2;
            this->maxInx = local_38;
          }
        }
      }
      if (this->minAlc < 0x7f) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&this->minInx);
        this->ordered = true;
      }
      else {
        this->ordered = true;
      }
    }
    else {
      for (local_48 = 0; local_48 < (int)sVar3; local_48 = local_48 + 1) {
        pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_48);
        iVar2 = Dish::getPrice(pvVar4);
        if (this->minAlc <= iVar2) {
          pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_48);
          DVar1 = Dish::getType(pvVar4);
          if (DVar1 == ALC) {
            pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_48);
            iVar2 = Dish::getPrice(pvVar4);
            if ((iVar2 == this->minAlc) && (this->minInx < local_48)) {
              this->minInx = local_48;
              pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_48);
              iVar2 = Dish::getPrice(pvVar4);
              this->minAlc = iVar2;
              std::vector<int,_std::allocator<int>_>::push_back
                        (__return_storage_ptr__,&this->minInx);
              return __return_storage_ptr__;
            }
            pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_48);
            iVar2 = Dish::getPrice(pvVar4);
            if (this->minAlc < iVar2) {
              pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_48);
              iVar2 = Dish::getPrice(pvVar4);
              if (iVar2 < local_24) {
                pvVar4 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,(long)local_48);
                local_24 = Dish::getPrice(pvVar4);
                size = local_48;
              }
            }
          }
        }
      }
      this->minInx = size;
      this->minAlc = local_24;
      if (this->minInx != 0x7f) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&this->minInx);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>  AlchoholicCustomer::order(const std::vector<Dish> &menu)
{
    int lastChecked = INT8_MAX;
    int lastCheckedIndex = INT8_MAX;
    std::vector<int> newOrder;
    int size = menu.size();
    if(minInx == maxInx)
        return newOrder;
    if(!ordered)
    {
        for (int i = 0; i < size; ++i)
        {
            if (menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < minAlc)
            {
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                minInx = i;
            }

            if(menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() >= maxAlc)
            {
                maxAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                maxInx = i;
            }
        }

        if(minAlc < INT8_MAX)
        {
            newOrder.push_back(minInx);
            ordered = true;
            return newOrder;
        }
        ordered = true;
        return newOrder;
    }
    for (int i = 0; i < size; ++i)
    {
        if(menu.at(static_cast<unsigned long>(i)).getPrice() >= minAlc && menu.at(
                static_cast<unsigned long>(i)).getType() == ALC)
        {
            if(menu.at(static_cast<unsigned long>(i)).getPrice() == minAlc && minInx < i)// && !changed
            {
                minInx = i;
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                newOrder.push_back(minInx);
                return newOrder;
            }
            else if(menu.at(static_cast<unsigned long>(i)).getPrice() > minAlc && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < lastChecked)
            {
                lastChecked = menu.at(static_cast<unsigned long>(i)).getPrice();
                lastCheckedIndex = i;
            }
        }
    }
    minInx = lastCheckedIndex;
    minAlc = lastChecked;
    if(minInx != INT8_MAX)
        newOrder.push_back(minInx);
    return newOrder;
}